

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::doJSONObjects(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr *pp_Var2;
  qpdf_stream_decode_level_e decode_level;
  int version;
  qpdf_json_stream_data_e json_stream_data;
  element_type *peVar3;
  size_t sVar4;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wanted_objects;
  QPDF *this_00;
  const_iterator cVar5;
  const_iterator cVar6;
  long *plVar7;
  QPDFObjGen *pQVar8;
  undefined8 uVar9;
  QPDFObjGen QVar10;
  QPDFObjectHandle *pQVar11;
  bool bVar12;
  QPDFObjGen in_stack_fffffffffffffec0;
  _Alloc_hider _Var13;
  QPDFObjGen in_stack_fffffffffffffec8;
  undefined8 in_stack_fffffffffffffed0;
  string key;
  undefined1 local_f0 [24];
  long lStack_d8;
  bool first_object;
  undefined7 uStack_cf;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  QPDF *local_b0;
  QPDFJob *local_a8;
  set wanted_og;
  QPDFObjGen og;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_b0 = pdf;
  local_a8 = this;
  if (peVar3->json_version == 1) {
    pp_Var2 = &wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
               _M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    ._0_8_ = pp_Var2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&wanted_og,"objects","");
    JSON::writeDictionaryKey(p,first,(string *)&wanted_og,1);
    if ((_Base_ptr *)
        wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
        _M_impl._0_8_ != pp_Var2) {
      operator_delete((void *)wanted_og.
                              super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                              ._M_t._M_impl._0_8_,
                      (ulong)((long)&(wanted_og.
                                      super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                                      ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                     _M_color + 1));
    }
    first_object = true;
    JSON::writeDictionaryOpen(p,&first_object,1);
    sVar4 = *(size_t *)
             ((long)&(((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->json_objects)._M_t._M_impl.super__Rb_tree_header + 0x20);
    getWantedJSONObjects(&wanted_og,this);
    QPDF::getAllObjects((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f0,pdf)
    ;
    if (local_f0._0_8_ != local_f0._8_8_) {
      pQVar11 = (QPDFObjectHandle *)local_f0._0_8_;
      do {
        QPDFObjectHandle::unparse_abi_cxx11_(&key,pQVar11);
        if (sVar4 == 0) {
LAB_0017a09a:
          QPDFObjectHandle::unparse_abi_cxx11_((string *)&stack0xfffffffffffffec0,pQVar11);
          JSON::writeDictionaryKey(p,&first_object,(string *)&stack0xfffffffffffffec0,2);
          if (in_stack_fffffffffffffec0 != (QPDFObjGen)&stack0xfffffffffffffed0) {
            operator_delete((void *)in_stack_fffffffffffffec0,in_stack_fffffffffffffed0 + 1);
          }
          QPDFObjectHandle::writeJSON(pQVar11,1,p,true,2);
          first_object = false;
        }
        else {
          in_stack_fffffffffffffec0 = QPDFObjectHandle::getObjGen(pQVar11);
          cVar5 = std::
                  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                  ::find((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                          *)&wanted_og,(key_type *)&stack0xfffffffffffffec0);
          if ((_Rb_tree_header *)cVar5._M_node !=
              &wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>.
               _M_t._M_impl.super__Rb_tree_header) goto LAB_0017a09a;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)key._M_dataplus._M_p != &key.field_2) {
          operator_delete(key._M_dataplus._M_p,key.field_2._M_allocated_capacity + 1);
        }
        pQVar11 = pQVar11 + 1;
      } while (pQVar11 != (QPDFObjectHandle *)local_f0._8_8_);
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
              ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)local_f0);
    if (sVar4 == 0) {
      bVar12 = true;
    }
    else {
      peVar3 = (local_a8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      key._M_dataplus._M_p = (pointer)&key.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&key,"trailer","");
      cVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(peVar3->json_objects)._M_t,&key);
      bVar12 = cVar6._M_node != &(peVar3->json_objects)._M_t._M_impl.super__Rb_tree_header._M_header
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key._M_dataplus._M_p != &key.field_2) {
        operator_delete(key._M_dataplus._M_p,key.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar12) {
      _Var13._M_p = &stack0xfffffffffffffed0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffec0,"trailer","");
      JSON::writeDictionaryKey(p,&first_object,(string *)&stack0xfffffffffffffec0,2);
      this_00 = local_b0;
      if (_Var13._M_p != &stack0xfffffffffffffed0) {
        operator_delete(_Var13._M_p,in_stack_fffffffffffffed0 + 1);
      }
      QPDF::getTrailer(this_00);
      QPDFObjectHandle::writeJSON((QPDFObjectHandle *)&stack0xfffffffffffffec0,1,p,true,2);
      if (in_stack_fffffffffffffec8 != (QPDFObjGen)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_fffffffffffffec8);
      }
      first_object = false;
    }
    JSON::writeDictionaryClose(p,first_object,1);
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                 *)&wanted_og);
  }
  else {
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_left =
         &wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
          _M_impl.super__Rb_tree_header._M_header;
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_color = _S_red;
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_node_count = 0;
    paVar1 = &key.field_2;
    key._M_dataplus._M_p = (pointer)paVar1;
    wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t._M_impl
    .super__Rb_tree_header._M_header._M_right =
         wanted_og.super_set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>._M_t.
         _M_impl.super__Rb_tree_header._M_header._M_left;
    std::__cxx11::string::_M_construct<char_const*>((string *)&key,"trailer","");
    cVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(peVar3->json_objects)._M_t,&key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key._M_dataplus._M_p != paVar1) {
      operator_delete(key._M_dataplus._M_p,key.field_2._M_allocated_capacity + 1);
    }
    if (cVar6._M_node != &(peVar3->json_objects)._M_t._M_impl.super__Rb_tree_header._M_header) {
      key._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&key,"trailer","");
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&wanted_og,&key);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key._M_dataplus._M_p != paVar1) {
        operator_delete(key._M_dataplus._M_p,key.field_2._M_allocated_capacity + 1);
      }
    }
    getWantedJSONObjects((set *)&key,this);
    if ((size_type *)key.field_2._8_8_ != &key._M_string_length) {
      uVar9 = key.field_2._8_8_;
      do {
        og.obj = ((_Rb_tree_node_base *)(uVar9 + 0x20))->_M_color;
        og.gen = *(int *)&((_Rb_tree_node_base *)(uVar9 + 0x20))->field_0x4;
        QPDFObjGen::unparse_abi_cxx11_((string *)&first_object,&og,' ');
        plVar7 = (long *)std::__cxx11::string::replace((ulong)&first_object,0,(char *)0x0,0x2688b9);
        pQVar11 = (QPDFObjectHandle *)(plVar7 + 2);
        if ((QPDFObjectHandle *)*plVar7 == pQVar11) {
          local_f0._16_8_ =
               (pQVar11->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          lStack_d8 = plVar7[3];
          local_f0._0_8_ = (QPDFObjectHandle *)(local_f0 + 0x10);
        }
        else {
          local_f0._16_8_ =
               (pQVar11->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_f0._0_8_ = (QPDFObjectHandle *)*plVar7;
        }
        local_f0._8_8_ = plVar7[1];
        *plVar7 = (long)pQVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        pQVar8 = (QPDFObjGen *)std::__cxx11::string::append(local_f0);
        QVar10 = (QPDFObjGen)(pQVar8 + 2);
        if (*pQVar8 == QVar10) {
          in_stack_fffffffffffffed0 = *(undefined8 *)QVar10;
          in_stack_fffffffffffffec0 = (QPDFObjGen)&stack0xfffffffffffffed0;
        }
        else {
          in_stack_fffffffffffffed0 = *(undefined8 *)QVar10;
          in_stack_fffffffffffffec0 = *pQVar8;
        }
        in_stack_fffffffffffffec8 = pQVar8[1];
        *pQVar8 = QVar10;
        pQVar8[1].obj = 0;
        pQVar8[1].gen = 0;
        *(undefined1 *)&pQVar8[2].obj = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_emplace_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&wanted_og,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffec0);
        if (in_stack_fffffffffffffec0 != (QPDFObjGen)&stack0xfffffffffffffed0) {
          operator_delete((void *)in_stack_fffffffffffffec0,in_stack_fffffffffffffed0 + 1);
        }
        if ((QPDFObjectHandle *)local_f0._0_8_ != (QPDFObjectHandle *)(local_f0 + 0x10)) {
          operator_delete((void *)local_f0._0_8_,
                          (ulong)((long)&(((Value *)local_f0._16_8_)->
                                         super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         ).
                                         super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                         .
                                         super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                                 + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(uStack_cf,first_object) != &local_c0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(uStack_cf,first_object),local_c0._M_allocated_capacity + 1);
        }
        uVar9 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar9);
      } while ((size_type *)uVar9 != &key._M_string_length);
    }
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                 *)&key);
    peVar3 = (local_a8->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    decode_level = peVar3->decode_level;
    version = peVar3->json_version;
    json_stream_data = peVar3->json_stream_data;
    uVar9 = 0x17a3fd;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Rb_tree(&local_60,
               (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&wanted_og);
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = uVar9;
    wanted_objects._M_t._M_impl._0_8_ = &local_60;
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)p;
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)in_stack_fffffffffffffec0;
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         (_Base_ptr)in_stack_fffffffffffffec8;
    wanted_objects._M_t._M_impl.super__Rb_tree_header._M_node_count = in_stack_fffffffffffffed0;
    QPDF::writeJSON(local_b0,version,p,false,first,decode_level,json_stream_data,
                    &peVar3->json_stream_prefix,wanted_objects);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_60);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&wanted_og);
  }
  return;
}

Assistant:

void
QPDFJob::doJSONObjects(Pipeline* p, bool& first, QPDF& pdf)
{
    if (m->json_version == 1) {
        JSON::writeDictionaryKey(p, first, "objects", 1);
        bool first_object = true;
        JSON::writeDictionaryOpen(p, first_object, 1);
        bool all_objects = m->json_objects.empty();
        auto wanted_og = getWantedJSONObjects();
        for (auto& obj: pdf.getAllObjects()) {
            std::string key = obj.unparse();

            if (all_objects || wanted_og.count(obj.getObjGen())) {
                JSON::writeDictionaryKey(p, first_object, obj.unparse(), 2);
                obj.writeJSON(1, p, true, 2);
                first_object = false;
            }
        }
        if (all_objects || m->json_objects.count("trailer")) {
            JSON::writeDictionaryKey(p, first_object, "trailer", 2);
            pdf.getTrailer().writeJSON(1, p, true, 2);
            first_object = false;
        }
        JSON::writeDictionaryClose(p, first_object, 1);
    } else {
        std::set<std::string> json_objects;
        if (m->json_objects.count("trailer")) {
            json_objects.insert("trailer");
        }
        for (auto og: getWantedJSONObjects()) {
            json_objects.emplace("obj:" + og.unparse(' ') + " R");
        }
        pdf.writeJSON(
            m->json_version,
            p,
            false,
            first,
            m->decode_level,
            m->json_stream_data,
            m->json_stream_prefix,
            json_objects);
    }
}